

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O1

string * __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::getParentLink_abi_cxx11_
          (string *__return_storage_ptr__,ThreeAxisAngularAccelerometerSensor *this)

{
  ThreeAxisAngularAccelerometerPrivateAttributes *pTVar1;
  pointer pcVar2;
  
  pTVar1 = this->pimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pTVar1->parent_link_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pTVar1->parent_link_name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ThreeAxisAngularAccelerometerSensor::getParentLink() const
{
    return(this->pimpl->parent_link_name);
}